

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_unpolar<ExchCXX::BuiltinEPC18_2>
               (double scal_fact,int N,const_host_buffer_type rho,host_buffer_type eps,
               host_buffer_type vxc)

{
  long in_RCX;
  long in_RDX;
  int in_EDI;
  double in_XMM0_Qa;
  double e;
  double v;
  int32_t i;
  double *in_stack_ffffffffffffffb8;
  double in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined4 local_2c;
  
  for (local_2c = 0; local_2c < in_EDI; local_2c = local_2c + 1) {
    lda_screening_interface<ExchCXX::BuiltinEPC18_2>::eval_exc_vxc_unpolar
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(double *)0x1c2a7d);
    *(double *)(in_RDX + (long)local_2c * 8) =
         in_XMM0_Qa * in_stack_ffffffffffffffc0 + *(double *)(in_RDX + (long)local_2c * 8);
    *(double *)(in_RCX + (long)local_2c * 8) =
         in_XMM0_Qa * local_38 + *(double *)(in_RCX + (long)local_2c * 8);
  }
  return;
}

Assistant:

LDA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_unpolar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    double v,e;
    traits::eval_exc_vxc_unpolar( rho[i], e, v );
    eps[i] += scal_fact * e;
    vxc[i] += scal_fact * v;

  }

}